

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_intersect(run_container_t *src_1,run_container_t *src_2)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint local_3c;
  uint local_38;
  int32_t xend;
  int32_t xstart;
  int32_t end;
  int32_t start;
  int32_t xrlepos;
  int32_t rlepos;
  _Bool if2;
  _Bool if1;
  run_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var2 = run_container_is_full(src_1);
  _Var3 = run_container_is_full(src_2);
  if ((_Var2) || (_Var3)) {
    if (_Var2) {
      _Var2 = run_container_empty(src_2);
      return (_Bool)((_Var2 ^ 0xffU) & 1);
    }
    if (_Var3) {
      _Var2 = run_container_empty(src_1);
      return (_Bool)((_Var2 ^ 0xffU) & 1);
    }
  }
  start = 0;
  end = 0;
  xstart = (int32_t)src_1->runs->value;
  xend = xstart + (uint)src_1->runs->length + 1;
  local_38 = (uint)src_2->runs->value;
  local_3c = local_38 + src_2->runs->length + 1;
  while( true ) {
    bVar1 = false;
    if (start < src_1->n_runs) {
      bVar1 = end < src_2->n_runs;
    }
    if (!bVar1) break;
    if (local_38 < (uint)xend) {
      if ((uint)xstart < local_3c) {
        return true;
      }
      end = end + 1;
      if (end < src_2->n_runs) {
        local_38 = (uint)src_2->runs[end].value;
        local_3c = local_38 + src_2->runs[end].length + 1;
      }
    }
    else {
      start = start + 1;
      if (start < src_1->n_runs) {
        xstart = (int32_t)src_1->runs[start].value;
        xend = xstart + (uint)src_1->runs[start].length + 1;
      }
    }
  }
  return false;
}

Assistant:

bool run_container_intersect(const run_container_t *src_1,
                                const run_container_t *src_2) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return !run_container_empty(src_2);
        }
        if (if2) {
        	return !run_container_empty(src_1);
        }
    }
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            return true;
        }
    }
    return false;
}